

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O0

IndexType __thiscall amrex::BATransformer::index_type(BATransformer *this)

{
  undefined4 *in_RDI;
  BATnull *in_stack_ffffffffffffffd8;
  uint local_4;
  
  switch(*in_RDI) {
  case 0:
    local_4 = (uint)BATnull::index_type(in_stack_ffffffffffffffd8);
    break;
  case 1:
    local_4 = (uint)BATindexType::index_type((BATindexType *)(in_RDI + 1));
    break;
  case 2:
    local_4 = (uint)BATcoarsenRatio::index_type((BATcoarsenRatio *)in_stack_ffffffffffffffd8);
    break;
  case 3:
    local_4 = (uint)BATindexType_coarsenRatio::index_type((BATindexType_coarsenRatio *)(in_RDI + 1))
    ;
    break;
  default:
    local_4 = (uint)BATbndryReg::index_type((BATbndryReg *)(in_RDI + 1));
  }
  return (IndexType)local_4;
}

Assistant:

IndexType index_type () const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.index_type();
        case     BATType::indexType:
            return m_op.m_indexType.index_type();
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.index_type();
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.index_type();
        default:
            return m_op.m_bndryReg.index_type();
        }
    }